

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int UnixVfs_Getenv(char *zVar,jx9_context *pCtx)

{
  int iVar1;
  char *zString;
  
  zString = getenv(zVar);
  if (zString == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    jx9_result_string(pCtx,zString,-1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int UnixVfs_Getenv(const char *zVar, jx9_context *pCtx)
{
	char *zEnv;
	zEnv = getenv(zVar);
	if( zEnv == 0 ){
	  return -1;
	}
	jx9_result_string(pCtx, zEnv, -1/*Compute length automatically*/);
	return JX9_OK;
}